

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O2

void EnterCriticalSection(LPCRITICAL_SECTION lpCriticalSection)

{
  CPalThread *pThread;
  
  if (PAL_InitializeChakraCoreCalled) {
    pThread = CorUnix::InternalGetCurrentThread();
    CorUnix::InternalEnterCriticalSection(pThread,lpCriticalSection);
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

void EnterCriticalSection(LPCRITICAL_SECTION lpCriticalSection)
{
    PERF_ENTRY(EnterCriticalSection);
    ENTRY("EnterCriticalSection(lpCriticalSection=%p)\n", lpCriticalSection);

    CPalThread * pThread = InternalGetCurrentThread();

    InternalEnterCriticalSection(pThread, lpCriticalSection);

    LOGEXIT("EnterCriticalSection returns void\n");
    PERF_EXIT(EnterCriticalSection);
}